

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
          (basic_istream<char,_std::char_traits<char>_> *is,basic_json_decode_options<char> *options
          )

{
  error_code ec;
  bool bVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  error_code *in_RSI;
  ser_error *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar3;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> reader;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc2c;
  json_errc __e;
  ser_error *this;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffc70;
  basic_json_decode_options<char> *in_stack_fffffffffffffc78;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffc80;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc88;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffc90;
  allocator<char> local_359 [703];
  undefined1 local_9a [2];
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_98;
  error_code *local_10;
  
  __s = local_9a + 1;
  this = in_RDI;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a;
  std::allocator<char>::allocator();
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(in_stack_fffffffffffffc80,(allocator_type *)in_stack_fffffffffffffc78,
                 (temp_allocator_type *)in_stack_fffffffffffffc70);
  std::allocator<char>::~allocator((allocator<char> *)local_9a);
  std::allocator<char>::~allocator((allocator<char> *)(local_9a + 1));
  std::allocator<char>::allocator();
  basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
  basic_json_reader<std::istream&>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             &in_stack_fffffffffffffc80->super_basic_json_visitor<char>,in_stack_fffffffffffffc78,
             (allocator<char> *)in_stack_fffffffffffffc70);
  std::allocator<char>::~allocator(local_359);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::read_next
            (in_stack_fffffffffffffc70);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done
            (in_stack_fffffffffffffc70);
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(&local_98);
  __e = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc2c);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::json_errc,void>(local_10,__e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,(allocator<char> *)this);
    ec._M_cat = (error_category *)this_00;
    ec._0_8_ = __s;
    ser_error::ser_error(this,ec,(string *)in_RDI);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)in_stack_fffffffffffffc78);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::~basic_json_reader
            (in_stack_fffffffffffffc20);
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                   *)in_stack_fffffffffffffc20);
  bVar3.field_0.int64_.val_ = extraout_RDX;
  bVar3.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar3.field_0;
}

Assistant:

static basic_json parse(std::basic_istream<char_type>& is, 
            const basic_json_decode_options<char_type>& options = basic_json_options<CharT>())
        {
            json_decoder<basic_json> decoder;
            basic_json_reader<char_type,stream_source<char_type>,Allocator> reader(is, decoder, options);
            reader.read_next();
            reader.check_done();
            if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(json_errc::source_error, "Failed to parse json stream"));
            }
            return decoder.get_result();
        }